

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_set_string_Test::ObjectTest_set_string_Test(ObjectTest_set_string_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_004a22e8;
  return;
}

Assistant:

TEST(ObjectTest, set_string) {
	object obj;

	obj.set(u8"Jessica");

	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), u8"Jessica");
	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());

	obj.set(u8"was"s);

	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), u8"was");
	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());

	obj.set(u8"here"sv);

	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), u8"here");
	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());

	obj.set(u8"");

	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), u8"");
	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());
}